

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O1

void __thiscall duckdb::Vector::Reference(Vector *this,Value *value)

{
  PhysicalType PVar1;
  bool bVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  undefined8 uVar4;
  VectorStructBuffer *this_00;
  child_list_t<LogicalType> *this_01;
  const_reference pvVar5;
  vector<duckdb::Value,_true> *this_02;
  const_reference other;
  Vector *pVVar6;
  VectorArrayBuffer *this_03;
  VectorListBuffer *this_04;
  VectorBuffer *pVVar7;
  pointer *__ptr;
  element_type *peVar8;
  size_type __n;
  templated_unique_single_t vector;
  templated_unique_single_t struct_buffer;
  _Head_base<0UL,_duckdb::Vector_*,_false> local_a8;
  _Head_base<0UL,_duckdb::VectorStructBuffer_*,_false> local_a0;
  pointer local_98;
  Vector *local_90;
  Value local_88;
  LogicalType local_48;
  
  this->vector_type = CONSTANT_VECTOR;
  local_a0._M_head_impl = (VectorStructBuffer *)GetTypeIdSize((value->type_).physical_type_);
  make_buffer<duckdb::VectorBuffer,unsigned_long>((duckdb *)&local_88,(unsigned_long *)&local_a0);
  peVar8 = local_88.type_.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar4 = local_88.type_._0_8_;
  local_88.type_.id_ = INVALID;
  local_88.type_.physical_type_ = ~INVALID;
  local_88.type_._2_6_ = 0;
  local_88.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  p_Var3 = (this->buffer).internal.
           super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->buffer).internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)uVar4;
  (this->buffer).internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar8;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  if (local_88.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_88.type_.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  PVar1 = (value->type_).physical_type_;
  if (PVar1 == LIST) {
    this_04 = (VectorListBuffer *)operator_new(0x48);
    VectorListBuffer::VectorListBuffer(this_04,&value->type_,0x800);
    local_88.type_._0_8_ = this_04;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<duckdb::VectorListBuffer*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88.type_.type_info_,this_04);
    peVar8 = local_88.type_.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar4 = local_88.type_._0_8_;
    local_88.type_.id_ = INVALID;
    local_88.type_.physical_type_ = ~INVALID;
    local_88.type_._2_6_ = 0;
    local_88.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    p_Var3 = (this->auxiliary).internal.
             super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (this->auxiliary).internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)uVar4;
    (this->auxiliary).internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar8;
    peVar8 = local_88.type_.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      peVar8 = local_88.type_.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
  }
  else {
    if (PVar1 == ARRAY) {
      this_03 = (VectorArrayBuffer *)operator_new(0x48);
      VectorArrayBuffer::VectorArrayBuffer(this_03,&value->type_,0x800);
      local_88.type_._0_8_ = this_03;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<duckdb::VectorArrayBuffer*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88.type_.type_info_,this_03);
      peVar8 = local_88.type_.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar4 = local_88.type_._0_8_;
      local_88.type_.id_ = INVALID;
      local_88.type_.physical_type_ = ~INVALID;
      local_88.type_._2_6_ = 0;
      local_88.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      p_Var3 = (this->auxiliary).internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      (this->auxiliary).internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)uVar4;
      (this->auxiliary).internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar8;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      if (local_88.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_88.type_.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      goto LAB_0132f3a2;
    }
    if (PVar1 == STRUCT) {
      this_00 = (VectorStructBuffer *)operator_new(0x48);
      VectorStructBuffer::VectorStructBuffer(this_00);
      local_a0._M_head_impl = this_00;
      this_01 = StructType::GetChildTypes_abi_cxx11_(&value->type_);
      local_98 = unique_ptr<duckdb::VectorStructBuffer,_std::default_delete<duckdb::VectorStructBuffer>,_true>
                 ::operator->((unique_ptr<duckdb::VectorStructBuffer,_std::default_delete<duckdb::VectorStructBuffer>,_true>
                               *)&local_a0);
      local_90 = this;
      if ((this_01->
          super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          ).
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this_01->
          super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          ).
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        local_98 = (pointer)&local_98->children;
        __n = 0;
        do {
          bVar2 = value->is_null;
          if (bVar2 == true) {
            pvVar5 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                     ::operator[](this_01,__n);
            LogicalType::LogicalType(&local_48,&pvVar5->second);
            Value::Value(&local_88,&local_48);
          }
          else {
            this_02 = StructValue::GetChildren(value);
            other = vector<duckdb::Value,_true>::operator[](this_02,__n);
            Value::Value(&local_88,other);
          }
          pVVar6 = (Vector *)operator_new(0x68);
          Vector(pVVar6,&local_88);
          local_a8._M_head_impl = pVVar6;
          Value::~Value(&local_88);
          if (bVar2 != false) {
            LogicalType::~LogicalType(&local_48);
          }
          ::std::
          vector<duckdb::unique_ptr<duckdb::Vector,std::default_delete<duckdb::Vector>,true>,std::allocator<duckdb::unique_ptr<duckdb::Vector,std::default_delete<duckdb::Vector>,true>>>
          ::
          emplace_back<duckdb::unique_ptr<duckdb::Vector,std::default_delete<duckdb::Vector>,true>>
                    ((vector<duckdb::unique_ptr<duckdb::Vector,std::default_delete<duckdb::Vector>,true>,std::allocator<duckdb::unique_ptr<duckdb::Vector,std::default_delete<duckdb::Vector>,true>>>
                      *)local_98,
                     (unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                     &local_a8);
          if (local_a8._M_head_impl != (Vector *)0x0) {
            ::std::default_delete<duckdb::Vector>::operator()
                      ((default_delete<duckdb::Vector> *)&local_a8,local_a8._M_head_impl);
          }
          __n = __n + 1;
        } while (__n < (ulong)(((long)(this_01->
                                      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                      ).
                                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this_01->
                                      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                      ).
                                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3) *
                              0x6db6db6db6db6db7));
      }
      local_88.type_._0_8_ = local_a0._M_head_impl;
      local_a0._M_head_impl = (VectorStructBuffer *)0x0;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<duckdb::VectorStructBuffer*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88.type_.type_info_,
                 (VectorStructBuffer *)local_88.type_._0_8_);
      peVar8 = local_88.type_.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar4 = local_88.type_._0_8_;
      pVVar6 = local_90;
      local_88.type_.id_ = INVALID;
      local_88.type_.physical_type_ = ~INVALID;
      local_88.type_._2_6_ = 0;
      local_88.type_.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      p_Var3 = (local_90->auxiliary).internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      (local_90->auxiliary).internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)uVar4;
      (local_90->auxiliary).internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar8;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      if (local_88.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_88.type_.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      if (value->is_null == true) {
        SetValue(pVVar6,0,value);
      }
      if (local_a0._M_head_impl == (VectorStructBuffer *)0x0) {
        return;
      }
      (*((local_a0._M_head_impl)->super_VectorBuffer)._vptr_VectorBuffer[1])();
      return;
    }
    peVar8 = (element_type *)
             (this->auxiliary).internal.
             super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (this->auxiliary).internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    (this->auxiliary).internal.super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  if (peVar8 != (element_type *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar8);
  }
  pVVar7 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&this->buffer);
  this->data = (pVVar7->data).pointer;
LAB_0132f3a2:
  SetValue(this,0,value);
  return;
}

Assistant:

void Vector::Reference(const Value &value) {
	D_ASSERT(GetType().id() == value.type().id());
	this->vector_type = VectorType::CONSTANT_VECTOR;
	buffer = VectorBuffer::CreateConstantVector(value.type());
	auto internal_type = value.type().InternalType();
	if (internal_type == PhysicalType::STRUCT) {
		auto struct_buffer = make_uniq<VectorStructBuffer>();
		auto &child_types = StructType::GetChildTypes(value.type());
		auto &child_vectors = struct_buffer->GetChildren();
		for (idx_t i = 0; i < child_types.size(); i++) {
			auto vector =
			    make_uniq<Vector>(value.IsNull() ? Value(child_types[i].second) : StructValue::GetChildren(value)[i]);
			child_vectors.push_back(std::move(vector));
		}
		auxiliary = shared_ptr<VectorBuffer>(struct_buffer.release());
		if (value.IsNull()) {
			SetValue(0, value);
		}
	} else if (internal_type == PhysicalType::LIST) {
		auto list_buffer = make_uniq<VectorListBuffer>(value.type());
		auxiliary = shared_ptr<VectorBuffer>(list_buffer.release());
		data = buffer->GetData();
		SetValue(0, value);
	} else if (internal_type == PhysicalType::ARRAY) {
		auto array_buffer = make_uniq<VectorArrayBuffer>(value.type());
		auxiliary = shared_ptr<VectorBuffer>(array_buffer.release());
		SetValue(0, value);
	} else {
		auxiliary.reset();
		data = buffer->GetData();
		SetValue(0, value);
	}
}